

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindXor(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
                  Vec_Int_t **vUnatePairs,int fVerbose)

{
  Vec_Int_t *vUnatePairs_00;
  bool bVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  bool bVar3;
  Vec_Ptr_t *pOn;
  Vec_Ptr_t *pVVar4;
  
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
  }
  pVVar4 = (Vec_Ptr_t *)0x0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    vUnatePairs_00 = vUnatePairs[(long)pVVar4];
    vUnatePairs_00->nSize = 0;
    Gia_ManFindXorInt(pSets[(long)pVVar4],(word *)pOn,vBinateVars,vDivs,nWords,vUnatePairs_00);
    iVar2 = extraout_EDX;
    if (fVerbose != 0) {
      printf("UX%d =%5d ",pVVar4,(ulong)(uint)vUnatePairs[(long)pVVar4]->nSize);
      pOn = pVVar4;
      iVar2 = extraout_EDX_00;
    }
    pVVar4 = (Vec_Ptr_t *)0x1;
    bVar1 = false;
  } while (bVar3);
  iVar2 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],iVar2);
  return iVar2;
}

Assistant:

int Gia_ManFindXor( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vUnatePairs[n] );
        Gia_ManFindXorInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UX%d =%5d ", n, Vec_IntSize(vUnatePairs[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
}